

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-xtra.h
# Opt level: O2

Expression
dither(ComputationGraph *cg,Expression *expr,float pad_value,
      vector<float,_std::allocator<float>_> *aux_mem)

{
  long lVar1;
  pointer pfVar2;
  ComputationGraph *pCVar3;
  vector<float,_std::allocator<float>_> *in_RCX;
  undefined8 extraout_RDX;
  undefined4 uVar4;
  size_type __new_size;
  Expression EVar5;
  initializer_list<unsigned_int> x;
  initializer_list<dynet::expr::Expression> __l;
  initializer_list<dynet::expr::Expression> __l_00;
  allocator_type local_bd;
  float pad_value_local;
  _Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> local_b8;
  ComputationGraph *local_a0;
  undefined1 local_94 [4];
  Expression left_shift;
  Expression padded;
  Expression right_shift;
  undefined1 local_60 [24];
  uint local_48;
  Expression *local_40;
  uint local_38;
  
  lVar1 = *(long *)(expr->pg +
                   (ulong)*(uint *)&(aux_mem->super__Vector_base<float,_std::allocator<float>_>).
                                    _M_impl.super__Vector_impl_data._M_finish * 8);
  pfVar2 = (in_RCX->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((in_RCX->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_finish != pfVar2) {
    (in_RCX->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
    _M_finish = pfVar2;
  }
  uVar4 = 1;
  __new_size = (size_type)*(uint *)(lVar1 + 0x24);
  if (*(uint *)(lVar1 + 0x3c) < 2) {
    __new_size = 1;
  }
  pad_value_local = pad_value;
  local_a0 = cg;
  std::vector<float,_std::allocator<float>_>::resize(in_RCX,__new_size,&pad_value_local);
  if (1 < *(uint *)(lVar1 + 0x3c)) {
    uVar4 = *(undefined4 *)(lVar1 + 0x24);
  }
  x._M_len = 1;
  x._M_array = (iterator)&local_b8;
  local_b8._M_impl.super__Vector_impl_data._M_start._0_4_ = uVar4;
  dynet::Dim::Dim((Dim *)local_60,x);
  dynet::ComputationGraph::add_input((Dim *)local_94,(vector *)expr);
  local_60._8_4_ = local_94;
  local_60._16_8_ =
       (aux_mem->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
       _M_start;
  local_48 = *(uint *)&(aux_mem->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                       super__Vector_impl_data._M_finish;
  local_38 = (uint)local_94;
  __l._M_len = 3;
  __l._M_array = (iterator)local_60;
  local_60._0_8_ = expr;
  local_40 = expr;
  std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::vector
            ((vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *)&local_b8,
             __l,(allocator_type *)&left_shift);
  dynet::expr::detail::
  f<dynet::Concatenate,std::vector<dynet::expr::Expression,std::allocator<dynet::expr::Expression>>>
            ((detail *)&padded,
             (vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *)&local_b8)
  ;
  std::_Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::
  ~_Vector_base(&local_b8);
  dynet::expr::pickrange(&left_shift,(uint)&padded,2);
  dynet::expr::pickrange(&right_shift,(uint)&padded,0);
  local_60._0_8_ = left_shift.pg;
  local_60._8_4_ = left_shift.i.t;
  local_60._16_8_ =
       (aux_mem->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
       _M_start;
  local_48 = *(uint *)&(aux_mem->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                       super__Vector_impl_data._M_finish;
  local_40 = (Expression *)right_shift.pg;
  local_38 = right_shift.i.t;
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)local_60;
  std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::vector
            ((vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *)&local_b8,
             __l_00,&local_bd);
  pCVar3 = local_a0;
  dynet::expr::detail::
  f<dynet::ConcatenateColumns,std::vector<dynet::expr::Expression,std::allocator<dynet::expr::Expression>>>
            ((detail *)local_a0,
             (vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *)&local_b8)
  ;
  std::_Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::
  ~_Vector_base(&local_b8);
  EVar5._8_8_ = extraout_RDX;
  EVar5.pg = pCVar3;
  return EVar5;
}

Assistant:

Expression dither(ComputationGraph &cg, const Expression &expr, float pad_value, std::vector<float> *aux_mem)
{
    const auto& shape = cg.nodes[expr.i]->dim;
    aux_mem->clear();
    aux_mem->resize(shape.cols(), pad_value);
    Expression padding(&cg, cg.add_input(Dim({shape.cols()}), aux_mem));
    Expression padded = concatenate(std::vector<Expression>({padding, expr, padding}));
    Expression left_shift = pickrange(padded, 2, shape.rows()+2);
    Expression right_shift = pickrange(padded, 0, shape.rows());
    return concatenate_cols(std::vector<Expression>({left_shift, expr, right_shift}));
}